

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O0

void __thiscall bloom_filter::bloom_filter(bloom_filter *this,bloom_parameters *p)

{
  value_type_conflict3 local_25 [13];
  bloom_parameters *local_18;
  bloom_parameters *p_local;
  bloom_filter *this_local;
  
  this->_vptr_bloom_filter = (_func_int **)&PTR__bloom_filter_001d5ba0;
  local_18 = p;
  p_local = (bloom_parameters *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->salt_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->bit_table_);
  this->projected_element_count_ = local_18->projected_element_count;
  this->inserted_element_count_ = 0;
  this->random_seed_ = local_18->random_seed * 0xa5a5a5a5 + 1;
  this->desired_false_positive_probability_ = local_18->false_positive_probability;
  this->salt_count_ = (local_18->optimal_parameters).number_of_hashes;
  this->table_size_ = (local_18->optimal_parameters).table_size;
  generate_unique_salt(this);
  local_25[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bit_table_,this->table_size_ >> 3,local_25);
  return;
}

Assistant:

bloom_filter(const bloom_parameters& p)
   : projected_element_count_(p.projected_element_count),
     inserted_element_count_(0),
     random_seed_((p.random_seed * 0xA5A5A5A5) + 1),
     desired_false_positive_probability_(p.false_positive_probability)
   {
      salt_count_ = p.optimal_parameters.number_of_hashes;
      table_size_ = p.optimal_parameters.table_size;

      generate_unique_salt();

      bit_table_.resize(table_size_ / bits_per_char, static_cast<unsigned char>(0x00));
   }